

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O3

void duckdb::ArrayFixedCombine<double,duckdb::CrossProductOp,3ul>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  BoundFunctionExpression *pBVar12;
  reference pvVar13;
  Vector *vector;
  Vector *vector_00;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  InvalidInputException *pIVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  long lVar18;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_160;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  string local_e0;
  long *local_c0 [2];
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [2];
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pbVar5 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(args + 0x18);
  pvVar13 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(pvVar13);
  pvVar13 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vector_00 = (Vector *)duckdb::ArrayVector::GetEntry(pvVar13);
  lVar14 = duckdb::ArrayVector::GetEntry(result);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  pvVar13 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar13,(UnifiedVectorFormat *)pbVar5);
  pvVar13 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar13,(UnifiedVectorFormat *)pbVar5);
  if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar6 = *(long *)(vector + 0x20);
    lVar7 = *(long *)(vector_00 + 0x20);
    lVar14 = *(long *)(lVar14 + 0x20);
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar15 = pbVar17;
      if (*local_78[0] != 0) {
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)*(uint *)(*local_78[0] + (long)pbVar17 * 4);
      }
      params = pbVar17;
      if (*local_c0[0] != 0) {
        params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)*(uint *)(*local_c0[0] + (long)pbVar17 * 4);
      }
      if (((local_68 == 0) ||
          ((*(ulong *)(local_68 + ((ulong)pbVar15 >> 6) * 8) >> ((ulong)pbVar15 & 0x3f) & 1) != 0))
         && ((local_b0 == 0 ||
             ((*(ulong *)(local_b0 + ((ulong)params >> 6) * 8) >> ((ulong)params & 0x3f) & 1) != 0))
            )) {
        if ((ulong)((long)pbVar15 * 3) < 0xfffffffffffffffd && *(long *)(vector + 0x28) != 0) {
          lVar18 = 0;
          do {
            uVar1 = (long)pbVar15 * 3 + lVar18;
            if ((*(ulong *)(*(long *)(vector + 0x28) + (uVar1 >> 6) * 8) >> (uVar1 & 0x3f) & 1) == 0
               ) {
              pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_120[0] = local_110;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_120,"%s: left argument can not contain NULL values","");
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,*(long *)(pBVar12 + 0x60),
                         *(long *)(pBVar12 + 0x68) + *(long *)(pBVar12 + 0x60));
              StringUtil::Format<std::__cxx11::string>
                        (&local_160,(StringUtil *)local_120,&local_e0,params);
              duckdb::InvalidInputException::InvalidInputException(pIVar16,(string *)&local_160);
              __cxa_throw(pIVar16,&InvalidInputException::typeinfo,
                          std::runtime_error::~runtime_error);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
        }
        params_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)params * 3);
        if (params_00 <
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xfffffffffffffffd
            && *(long *)(vector_00 + 0x28) != 0) {
          lVar18 = 0;
          do {
            uVar1 = (long)&(params_00->_M_dataplus)._M_p + lVar18;
            if ((*(ulong *)(*(long *)(vector_00 + 0x28) + (uVar1 >> 6) * 8) >> (uVar1 & 0x3f) & 1)
                == 0) {
              pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_140[0] = local_130;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_140,"%s: right argument can not contain NULL values","");
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,*(long *)(pBVar12 + 0x60),
                         *(long *)(pBVar12 + 0x68) + *(long *)(pBVar12 + 0x60));
              StringUtil::Format<std::__cxx11::string>
                        (&local_160,(StringUtil *)local_140,&local_100,params_00);
              duckdb::InvalidInputException::InvalidInputException(pIVar16,(string *)&local_160);
              __cxa_throw(pIVar16,&InvalidInputException::typeinfo,
                          std::runtime_error::~runtime_error);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
        }
        dVar3 = *(double *)(lVar6 + (long)pbVar15 * 0x18);
        dVar4 = *(double *)(lVar7 + (long)params * 0x18);
        pdVar2 = (double *)(lVar6 + 8 + (long)pbVar15 * 0x18);
        dVar8 = *pdVar2;
        dVar9 = pdVar2[1];
        pdVar2 = (double *)(lVar7 + 8 + (long)params * 0x18);
        dVar10 = *pdVar2;
        dVar11 = pdVar2[1];
        pdVar2 = (double *)(lVar14 + (long)pbVar17 * 0x18);
        *pdVar2 = dVar11 * dVar8 - dVar9 * dVar10;
        pdVar2[1] = dVar4 * dVar9 - dVar3 * dVar11;
        *(double *)(lVar14 + 0x10 + (long)pbVar17 * 0x18) = dVar3 * dVar10 - dVar4 * dVar8;
      }
      else {
        duckdb::FlatVector::SetNull(result,(ulong)pbVar17,true);
      }
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar17->_M_dataplus)._M_p + 1);
    } while (pbVar17 != pbVar5);
    if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void ArrayFixedCombine(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);
	auto &res_child = ArrayVector::GetEntry(result);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(res_child);

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * N;
		if (!lhs_child_validity.CheckAllValid(left_offset + N, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * N;
		if (!rhs_child_validity.CheckAllValid(right_offset + N, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}
		const auto result_offset = i * N;

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;
		const auto res_data_ptr = res_data + result_offset;

		OP::Operation(lhs_data_ptr, rhs_data_ptr, res_data_ptr, N);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}